

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_bin_lower_slab(tsdn_t *tsdn,arena_t *arena,extent_t *slab,bin_t *bin)

{
  int iVar1;
  uint uVar2;
  arena_t *in_RCX;
  extent_t *in_RDX;
  bin_t *in_stack_ffffffffffffffd8;
  
  if (((in_RCX->stats).resident.repr != 0) &&
     (iVar1 = extent_snad_comp(in_RDX,(extent_t *)in_RCX), 0 < iVar1)) {
    uVar2 = extent_nfree_get((extent_t *)(in_RCX->stats).resident.repr);
    if (uVar2 == 0) {
      arena_bin_slabs_full_insert(in_RCX,in_stack_ffffffffffffffd8,(extent_t *)0x121fbe);
    }
    else {
      arena_bin_slabs_nonfull_insert((bin_t *)in_RCX,(extent_t *)in_stack_ffffffffffffffd8);
    }
    (in_RCX->stats).resident.repr = (size_t)in_RDX;
    (in_RCX->stats).mutex_prof_data[0].max_wait_time.ns =
         (in_RCX->stats).mutex_prof_data[0].max_wait_time.ns + 1;
    return;
  }
  arena_bin_slabs_nonfull_insert((bin_t *)in_RCX,(extent_t *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void
arena_bin_lower_slab(tsdn_t *tsdn, arena_t *arena, extent_t *slab,
    bin_t *bin) {
	assert(extent_nfree_get(slab) > 0);

	/*
	 * Make sure that if bin->slabcur is non-NULL, it refers to the
	 * oldest/lowest non-full slab.  It is okay to NULL slabcur out rather
	 * than proactively keeping it pointing at the oldest/lowest non-full
	 * slab.
	 */
	if (bin->slabcur != NULL && extent_snad_comp(bin->slabcur, slab) > 0) {
		/* Switch slabcur. */
		if (extent_nfree_get(bin->slabcur) > 0) {
			arena_bin_slabs_nonfull_insert(bin, bin->slabcur);
		} else {
			arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		}
		bin->slabcur = slab;
		if (config_stats) {
			bin->stats.reslabs++;
		}
	} else {
		arena_bin_slabs_nonfull_insert(bin, slab);
	}
}